

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_CMap_New(FT_CMap_Class clazz,FT_Pointer init_data,FT_CharMap charmap,
                    FT_CMap_conflict *acmap)

{
  int iVar1;
  FT_Face pFVar2;
  FT_Memory memory;
  undefined4 uVar3;
  FT_Encoding FVar4;
  FT_UShort FVar5;
  FT_UShort FVar6;
  FT_CMap_conflict cmap;
  FT_CharMap *ppFVar7;
  FT_Error FVar8;
  FT_Error local_34 [2];
  FT_Error error;
  
  local_34[0] = 0;
  if (charmap == (FT_CharMap)0x0 || clazz == (FT_CMap_Class)0x0) {
    return 6;
  }
  pFVar2 = charmap->face;
  if (pFVar2 == (FT_Face)0x0) {
    return 6;
  }
  memory = pFVar2->memory;
  cmap = (FT_CMap_conflict)ft_mem_alloc(memory,clazz->size,local_34);
  FVar8 = local_34[0];
  if (local_34[0] == 0) {
    uVar3 = *(undefined4 *)((long)&charmap->face + 4);
    FVar4 = charmap->encoding;
    FVar5 = charmap->platform_id;
    FVar6 = charmap->encoding_id;
    *(undefined4 *)&(cmap->charmap).face = *(undefined4 *)&charmap->face;
    *(undefined4 *)((long)&(cmap->charmap).face + 4) = uVar3;
    (cmap->charmap).encoding = FVar4;
    (cmap->charmap).platform_id = FVar5;
    (cmap->charmap).encoding_id = FVar6;
    cmap->clazz = clazz;
    if ((clazz->init == (FT_CMap_InitFunc)0x0) ||
       (local_34[0] = (*clazz->init)(cmap,init_data), local_34[0] == 0)) {
      ppFVar7 = (FT_CharMap *)
                ft_mem_realloc(memory,8,(long)pFVar2->num_charmaps,(long)pFVar2->num_charmaps + 1,
                               pFVar2->charmaps,local_34);
      pFVar2->charmaps = ppFVar7;
      if (local_34[0] == 0) {
        iVar1 = pFVar2->num_charmaps;
        pFVar2->num_charmaps = iVar1 + 1;
        ppFVar7[iVar1] = (FT_CharMap)cmap;
        FVar8 = 0;
        goto LAB_001ec46f;
      }
    }
    FVar8 = local_34[0];
    ft_cmap_done_internal(cmap);
    cmap = (FT_CMap_conflict)0x0;
  }
LAB_001ec46f:
  if (acmap != (FT_CMap_conflict *)0x0) {
    *acmap = cmap;
  }
  return FVar8;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_CMap_New( FT_CMap_Class  clazz,
               FT_Pointer     init_data,
               FT_CharMap     charmap,
               FT_CMap       *acmap )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Face    face;
    FT_Memory  memory;
    FT_CMap    cmap = NULL;


    if ( !clazz || !charmap || !charmap->face )
      return FT_THROW( Invalid_Argument );

    face   = charmap->face;
    memory = FT_FACE_MEMORY( face );

    if ( !FT_ALLOC( cmap, clazz->size ) )
    {
      cmap->charmap = *charmap;
      cmap->clazz   = clazz;

      if ( clazz->init )
      {
        error = clazz->init( cmap, init_data );
        if ( error )
          goto Fail;
      }

      /* add it to our list of charmaps */
      if ( FT_RENEW_ARRAY( face->charmaps,
                           face->num_charmaps,
                           face->num_charmaps + 1 ) )
        goto Fail;

      face->charmaps[face->num_charmaps++] = (FT_CharMap)cmap;
    }

  Exit:
    if ( acmap )
      *acmap = cmap;

    return error;

  Fail:
    ft_cmap_done_internal( cmap );
    cmap = NULL;
    goto Exit;
  }